

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall
LexerTest_LexWhitespace_Test::~LexerTest_LexWhitespace_Test(LexerTest_LexWhitespace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexWhitespace) {
  Lexer lexer(" 1\t2\n3\r4 \n\n\t 5 "sv);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{1, 1}));
  EXPECT_EQ(lexer.takeI32(), 1);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{1, 3}));
  EXPECT_EQ(lexer.takeI32(), 2);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{2, 0}));
  EXPECT_EQ(lexer.takeI32(), 3);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{2, 2}));
  EXPECT_EQ(lexer.takeI32(), 4);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{4, 2}));
  EXPECT_EQ(lexer.takeI32(), 5);

  ASSERT_TRUE(lexer.empty());
}